

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O2

void __thiscall
QColumnViewPrivate::checkColumnCreation(QColumnViewPrivate *this,QModelIndex *parent)

{
  QAbstractItemModel *pQVar1;
  QAbstractItemView *this_00;
  bool bVar2;
  char cVar3;
  int i;
  ulong uVar4;
  long in_FS_OFFSET;
  QModelIndex QStack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractItemView::currentIndex
            (&QStack_48,
             *(QAbstractItemView **)
              &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
               super_QFramePrivate.super_QWidgetPrivate.field_0x8);
  bVar2 = ::comparesEqual(parent,&QStack_48);
  if (bVar2) {
    pQVar1 = (this->super_QAbstractItemViewPrivate).model;
    cVar3 = (**(code **)(*(long *)pQVar1 + 0x88))(pQVar1,parent);
    if (cVar3 != '\0') {
      uVar4 = 0;
      do {
        if ((ulong)(this->columns).d.size <= uVar4) goto LAB_0050b72f;
        this_00 = (QAbstractItemView *)(this->columns).d.ptr[uVar4];
        QAbstractItemView::rootIndex(&QStack_48,this_00);
        bVar2 = ::comparesEqual(&QStack_48,parent);
        uVar4 = uVar4 + 1;
      } while (!bVar2);
      if (this_00 == (QAbstractItemView *)this->previewColumn) {
        closeColumns(this,parent,false);
        createColumn(this,parent,true);
      }
    }
  }
LAB_0050b72f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColumnViewPrivate::checkColumnCreation(const QModelIndex &parent)
{
    if (parent == q_func()->currentIndex() && model->hasChildren(parent)) {
        //the parent has children and is the current
        //let's try to find out if there is already a mapping that is good
        for (int i = 0; i < columns.size(); ++i) {
            QAbstractItemView *view = columns.at(i);
            if (view->rootIndex() == parent) {
                if (view == previewColumn) {
                    //let's recreate the parent
                    closeColumns(parent, false);
                    createColumn(parent, true /*show*/);
                }
                break;
            }
        }
    }
}